

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

bool Assimp::IFC::TryAddOpenings_Poly2Tri
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh)

{
  pointer *ppaVar1;
  double dVar2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  pointer paVar5;
  element_type *peVar6;
  void *pvVar7;
  IfcSolidModel *pIVar8;
  _func_int **pp_Var9;
  iterator __position;
  long64 lVar10;
  CDT *this;
  pointer pvVar11;
  pointer pvVar12;
  pointer paVar13;
  pointer ppOVar14;
  bool bVar15;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *pvVar16;
  ulong uVar17;
  IntPoint *pIVar18;
  IntPoint *pIVar19;
  pointer paVar20;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range3;
  IfcVector3 *xx;
  pointer pTVar21;
  pointer pEVar22;
  pointer pTVar23;
  IfcVector2 *pip_1;
  pointer paVar24;
  pointer pIVar25;
  IfcSolidModel *pIVar26;
  IfcVector2 *pip;
  IntPoint *pIVar27;
  IfcVector3 *x;
  pointer puVar28;
  long lVar29;
  pointer pIVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  double dVar38;
  double dVar39;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour;
  Polygon hole;
  IfcVector3 vv_extr;
  bool ok;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  contours;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  IfcMatrix3 m;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> contour_points;
  Polygons holes_union;
  ExPolygons clipped;
  IfcVector3 nor;
  Clipper clipper_holes;
  aiVector3t<double> local_3f8 [2];
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_3c8;
  pointer local_3a8;
  CDT *local_3a0;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_398;
  double local_378;
  double local_370;
  double local_368;
  bool local_359;
  pointer local_358;
  pointer local_350;
  pointer local_348;
  pointer local_340;
  double local_338;
  pointer local_330;
  pointer local_328;
  double local_320;
  double local_318;
  double local_310;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  local_308;
  pointer local_2f0;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_2e8;
  IfcMatrix3 local_2c8;
  pointer local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> local_258;
  Polygons local_238;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  ExPolygons local_1f8;
  pointer local_1d8;
  pointer local_1d0;
  IfcVector3 local_1c8;
  Clipper local_1a8;
  
  LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5a13fa);
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_1c8.z = 0.0;
  DerivePlaneCoordinateSpace(&local_2c8,curmesh,&local_359,&local_1c8);
  if (local_359 == true) {
    dVar38 = local_2c8.b1 * -local_2c8.a2;
    local_3a8 = (pointer)local_2c8.c2;
    dVar39 = -local_2c8.a3;
    local_318 = local_2c8.b2 * dVar39 * local_2c8.c1 +
                local_2c8.a3 * local_2c8.b1 * local_2c8.c2 +
                dVar38 * local_2c8.c3 +
                local_2c8.a2 * local_2c8.b3 * local_2c8.c1 +
                (local_2c8.a1 * local_2c8.b2 * local_2c8.c3 -
                local_2c8.b3 * local_2c8.a1 * local_2c8.c2);
    if ((local_318 != 0.0) || (NAN(local_318))) {
      local_318 = 1.0 / local_318;
      local_260 = -local_318;
      local_208._8_8_ = 0;
      local_208._0_8_ = (local_2c8.a2 * local_2c8.c3 + local_2c8.c2 * dVar39) * local_260;
      local_278 = (local_2c8.b1 * local_2c8.c3 - local_2c8.b3 * local_2c8.c1) * local_260;
      local_310 = (local_2c8.b3 * local_2c8.a1 + dVar39 * local_2c8.b1) * local_260;
      local_260 = (local_2c8.a1 * local_2c8.c2 + -local_2c8.a2 * local_2c8.c1) * local_260;
      local_320 = (local_2c8.b2 * local_2c8.c3 - local_2c8.c2 * local_2c8.b3) * local_318;
      local_218._8_8_ = 0;
      local_218._0_8_ = (local_2c8.a2 * local_2c8.b3 + local_2c8.b2 * dVar39) * local_318;
      local_270 = (local_2c8.c3 * local_2c8.a1 + local_2c8.c1 * dVar39) * local_318;
      local_268 = (local_2c8.b1 * local_2c8.c2 - local_2c8.b2 * local_2c8.c1) * local_318;
      local_318 = (local_2c8.a1 * local_2c8.b2 + dVar38) * local_318;
    }
    else {
      local_208 = ZEXT816(0x7ff8000000000000);
      local_218 = ZEXT816(0x7ff8000000000000);
      local_278 = NAN;
      local_270 = NAN;
      local_310 = NAN;
      local_268 = NAN;
      local_260 = NAN;
      local_320 = NAN;
      local_318 = NAN;
    }
    local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (aiVector2t<double> *)0x0;
    local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (aiVector2t<double> *)0x0;
    local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (aiVector2t<double> *)0x0;
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (&local_2e8,
               ((long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    paVar20 = (curmesh->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    paVar5 = (curmesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_358 = (pointer)nors;
    if (paVar20 == paVar5) {
      local_3a0 = (CDT *)0xbff0000000000000;
      uVar31 = 0x20000000;
      uVar35 = 0x4202a05f;
      local_378 = -10000000000.0;
      uVar33 = 0x20000000;
      uVar37 = 0xc202a05f;
      local_370 = 10000000000.0;
    }
    else {
      local_370 = 10000000000.0;
      local_368 = 10000000000.0;
      local_3a8 = (pointer)0xc202a05f20000000;
      local_378 = -10000000000.0;
      do {
        local_2f0 = (pointer)paVar20->x;
        local_330 = (pointer)paVar20->y;
        local_338 = paVar20->z;
        local_340 = (pointer)(local_2c8.a3 * local_338 +
                             local_2c8.a1 * (double)local_2f0 + local_2c8.a2 * (double)local_330);
        local_328 = (pointer)(local_2c8.b3 * local_338 +
                             local_2c8.b1 * (double)local_2f0 + local_2c8.b2 * (double)local_330);
        local_348 = (pointer)local_2c8.c1;
        local_350 = (pointer)local_2c8.c2;
        local_3a0 = (CDT *)local_2c8.c3;
        local_1a8._vptr_Clipper = (_func_int **)local_340;
        local_1a8.m_PolyOuts.
        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_328;
        if (local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&local_2e8,
                     (iterator)
                     local_2e8.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(aiVector2t<double> *)&local_1a8);
        }
        else {
          (local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->x = (double)local_340;
          (local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->y = (double)local_328;
          local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_2e8.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar32 = (undefined4)((ulong)local_340 >> 0x20);
        uVar33 = SUB84(local_370,0);
        uVar31 = (int)((ulong)local_370 >> 0x20);
        if ((double)local_340 <= local_370) {
          uVar33 = (int)local_340;
          uVar31 = uVar32;
        }
        local_370 = (double)CONCAT44(uVar31,uVar33);
        uVar34 = (undefined4)((ulong)local_328 >> 0x20);
        uVar31 = SUB84(local_368,0);
        uVar35 = (int)((ulong)local_368 >> 0x20);
        if ((double)local_328 <= local_368) {
          uVar31 = (int)local_328;
          uVar35 = uVar34;
        }
        local_368 = (double)CONCAT44(uVar35,uVar31);
        uVar33 = (int)local_3a8;
        uVar37 = (int)((ulong)local_3a8 >> 0x20);
        if ((double)local_3a8 <= (double)local_340) {
          uVar33 = (int)local_340;
          uVar37 = uVar32;
        }
        local_3a8 = (pointer)CONCAT44(uVar37,uVar33);
        uVar32 = SUB84(local_378,0);
        uVar36 = (int)((ulong)local_378 >> 0x20);
        if (local_378 <= (double)local_328) {
          uVar32 = (int)local_328;
          uVar36 = uVar34;
        }
        local_378 = (double)CONCAT44(uVar36,uVar32);
        paVar20 = paVar20 + 1;
      } while (paVar20 != paVar5);
      local_3a0 = (CDT *)((double)local_3a0 * local_338 +
                         (double)local_348 * (double)local_2f0 +
                         (double)local_330 * (double)local_350);
    }
    paVar20 = local_358;
    local_3a8 = (pointer)((double)CONCAT44(uVar37,uVar33) - local_370);
    local_368 = (double)CONCAT44(uVar35,uVar31);
    local_378 = local_378 - (double)CONCAT44(uVar35,uVar31);
    dVar38 = (double)local_3a8 * (double)local_3a8 + local_378 * local_378;
    if (dVar38 < 0.0) {
      dVar38 = sqrt(dVar38);
    }
    else {
      dVar38 = SQRT(dVar38);
    }
    if ((dVar38 == 0.0) && (!NAN(dVar38))) {
      __assert_fail("vmax.Length()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x5dc,
                    "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                   );
    }
    local_1f8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ClipperLib::Clipper::Clipper(&local_1a8);
    pTVar23 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar21 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar23 != pTVar21) {
      lVar29 = 0;
      local_340 = pTVar21;
      do {
        dVar38 = paVar20->x;
        if ((0.9999989867210388 <=
             ABS(local_1c8.z * *(double *)((long)dVar38 + 0x10 + lVar29 * 0x18) +
                 local_1c8.x * *(double *)((long)dVar38 + lVar29 * 0x18) +
                 local_1c8.y * *(double *)((long)dVar38 + 8 + lVar29 * 0x18))) &&
           (peVar6 = (pTVar23->profileMesh).
                     super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           2 < (ulong)(((long)(peVar6->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar6->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
           )) {
          local_3f8[0].x = 0.0;
          local_3f8[0].y = 0.0;
          local_3f8[0].z = 0.0;
          paVar5 = (peVar6->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (paVar20 = (peVar6->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; dVar38 = local_3f8[0].y,
              paVar20 != paVar5; paVar20 = paVar20 + 1) {
            dVar38 = paVar20->x;
            dVar39 = paVar20->y;
            dVar2 = paVar20->z;
            local_3c8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(local_2c8.a3 * dVar2 + local_2c8.a1 * dVar38 + local_2c8.a2 * dVar39);
            local_3c8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)(local_2c8.b3 * dVar2 + local_2c8.b1 * dVar38 + dVar39 * local_2c8.b2);
            local_3c8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(local_2c8.c3 * dVar2 + local_2c8.c1 * dVar38 + dVar39 * local_2c8.c2);
            dVar38 = dVar38 + (pTVar23->extrusionDir).x;
            dVar39 = dVar39 + (pTVar23->extrusionDir).y;
            dVar2 = dVar2 + (pTVar23->extrusionDir).z;
            local_398.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(local_2c8.a3 * dVar2 + local_2c8.a1 * dVar38 + local_2c8.a2 * dVar39);
            local_398.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)(local_2c8.b3 * dVar2 + local_2c8.b1 * dVar38 + local_2c8.b2 * dVar39);
            local_398.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(dVar2 * local_2c8.c3 + dVar38 * local_2c8.c1 + dVar39 * local_2c8.c2);
            pvVar16 = &local_3c8;
            if (ABS((double)local_398.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (double)local_3a0)
                < ABS((double)local_3c8.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - (double)local_3a0
                     )) {
              pvVar16 = &local_398;
            }
            local_308.
            super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(pvVar16->
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          )._M_impl.super__Vector_impl_data._M_start;
            local_308.
            super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(pvVar16->
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
            local_3c8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)local_308.
                          super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            local_3c8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)local_308.
                          super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_3c8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pvVar16->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_3f8[0].y == local_3f8[0].z) {
              std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
              _M_realloc_insert<aiVector2t<double>>
                        ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)local_3f8,
                         (iterator)local_3f8[0].y,(aiVector2t<double> *)&local_308);
            }
            else {
              *(double *)local_3f8[0].y =
                   (double)local_308.
                           super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              *(pointer *)((long)local_3f8[0].y + 8) =
                   local_308.
                   super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_3f8[0].y = (double)((long)local_3f8[0].y + 0x10);
            }
          }
          local_3c8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start = (IntPoint *)0x0;
          local_3c8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish = (IntPoint *)0x0;
          local_3c8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
          for (pIVar27 = (IntPoint *)local_3f8[0].x; pIVar27 != (IntPoint *)dVar38;
              pIVar27 = pIVar27 + 1) {
            pIVar27->X = (long64)(((double)pIVar27->X - local_370) / (double)local_3a8);
            pIVar27->Y = (long64)(((double)pIVar27->Y - local_368) / local_378);
            dVar39 = (double)pIVar27->X * 1518500249.0;
            uVar17 = (ulong)dVar39;
            local_398.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((long)(dVar39 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17);
            dVar39 = (double)pIVar27->Y * 1518500249.0;
            uVar17 = (ulong)dVar39;
            local_398.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)(dVar39 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17);
            if (local_3c8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_3c8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
              _M_realloc_insert<ClipperLib::IntPoint>
                        (&local_3c8,
                         (iterator)
                         local_3c8.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(IntPoint *)&local_398);
            }
            else {
              (local_3c8.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->X =
                   (long64)local_398.
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              (local_3c8.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->Y =
                   (long64)local_398.
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_3c8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_3c8.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          bVar15 = ClipperLib::Orientation(&local_3c8);
          pTVar21 = local_340;
          paVar20 = local_358;
          if ((!bVar15) &&
             (pIVar19 = local_3c8.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,
             pIVar27 = local_3c8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             local_3c8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start < pIVar19 &&
             local_3c8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start !=
             local_3c8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)) {
            do {
              pIVar18 = pIVar27 + 1;
              local_398.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar27->X;
              local_398.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar27->Y;
              lVar10 = pIVar19->Y;
              pIVar27->X = pIVar19->X;
              pIVar27->Y = lVar10;
              pIVar19->X = (long64)local_398.
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
              pIVar19->Y = (long64)local_398.
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
              pIVar19 = pIVar19 + -1;
              pIVar27 = pIVar18;
            } while (pIVar18 < pIVar19);
          }
          ClipperLib::ClipperBase::AddPolygon
                    ((ClipperBase *)
                     ((long)&local_1a8._vptr_Clipper +
                     (long)(((pointer)((long)local_1a8._vptr_Clipper + -0x58))->wallPoints).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start),&local_3c8,ptSubject);
          if (local_3c8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start != (IntPoint *)0x0) {
            operator_delete(local_3c8.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_3c8.
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_3c8.
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((IntPoint *)local_3f8[0].x != (IntPoint *)0x0) {
            operator_delete((void *)local_3f8[0].x,(long)local_3f8[0].z - (long)local_3f8[0].x);
          }
        }
        lVar29 = lVar29 + 1;
        pTVar23 = pTVar23 + 1;
      } while (pTVar23 != pTVar21);
    }
    ClipperLib::Clipper::Execute(&local_1a8,ctUnion,&local_238,pftNonZero,pftNonZero);
    paVar13 = local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_238.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_238.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ClipperLib::Clipper::~Clipper(&local_1a8);
      bVar15 = false;
    }
    else {
      local_3f8[0].x = 0.0;
      local_3f8[0].y = 0.0;
      local_3f8[0].z = 0.0;
      if (local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        paVar24 = local_2e8.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          paVar24->x = (paVar24->x - local_370) / (double)local_3a8;
          paVar24->y = (paVar24->y - local_368) / local_378;
          dVar38 = paVar24->x * 1518500249.0;
          uVar17 = (ulong)dVar38;
          local_3c8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)(dVar38 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17);
          dVar38 = paVar24->y * 1518500249.0;
          uVar17 = (ulong)dVar38;
          local_3c8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)(dVar38 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17);
          if (local_3f8[0].y == local_3f8[0].z) {
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            _M_realloc_insert<ClipperLib::IntPoint>
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       local_3f8,(iterator)local_3f8[0].y,(IntPoint *)&local_3c8);
          }
          else {
            *(long64 *)local_3f8[0].y =
                 (long64)local_3c8.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)((long)local_3f8[0].y + 8) =
                 local_3c8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_3f8[0].y = (double)((long)local_3f8[0].y + 0x10);
          }
          paVar24 = paVar24 + 1;
        } while (paVar24 != paVar13);
      }
      bVar15 = ClipperLib::Orientation((Polygon *)local_3f8);
      if ((bVar15) &&
         (pIVar19 = (IntPoint *)((long)local_3f8[0].y + -0x10), pIVar27 = (IntPoint *)local_3f8[0].x
         , (ulong)local_3f8[0].x < pIVar19 && local_3f8[0].x != local_3f8[0].y)) {
        do {
          pIVar18 = pIVar27 + 1;
          local_3c8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar27->X;
          local_3c8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar27->Y;
          dVar38 = (double)pIVar19->Y;
          pIVar27->X = pIVar19->X;
          pIVar27->Y = (long64)dVar38;
          pIVar19->X = (long64)local_3c8.
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_start;
          pIVar19->Y = (long64)local_3c8.
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          pIVar19 = pIVar19 + -1;
          pIVar27 = pIVar18;
        } while (pIVar18 < pIVar19);
      }
      ClipperLib::Clipper::Clear(&local_1a8);
      ClipperLib::ClipperBase::AddPolygon
                ((ClipperBase *)
                 ((long)&local_1a8._vptr_Clipper +
                 (long)(((pointer)((long)local_1a8._vptr_Clipper + -0x58))->wallPoints).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start),(Polygon *)local_3f8,ptSubject);
      ClipperLib::ClipperBase::AddPolygons
                ((ClipperBase *)
                 ((long)&local_1a8._vptr_Clipper +
                 (long)(((pointer)((long)local_1a8._vptr_Clipper + -0x58))->wallPoints).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start),&local_238,ptClip);
      ClipperLib::Clipper::Execute(&local_1a8,ctDifference,&local_1f8,pftNonZero,pftNonZero);
      if ((IntPoint *)local_3f8[0].x != (IntPoint *)0x0) {
        operator_delete((void *)local_3f8[0].x,(long)local_3f8[0].z - (long)local_3f8[0].x);
      }
      ClipperLib::Clipper::~Clipper(&local_1a8);
      local_348 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      paVar20 = (curmesh->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish;
      local_358 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_328 = (pointer)&curmesh->mVertcnt;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dVar38 = 0.0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_350 = (curmesh->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      puVar28 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_280 = (curmesh->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_308.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_308.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_308.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2f0 = local_1f8.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if (local_1f8.
          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1f8.
          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        dVar38 = 0.0;
        uVar33 = local_218._12_4_;
        local_218._8_4_ = local_218._8_4_;
        local_218._0_8_ = local_218._0_8_ * (double)local_3a0;
        local_218._12_4_ = uVar33;
        local_310 = local_310 * (double)local_3a0;
        local_318 = local_318 * (double)local_3a0;
        pEVar22 = local_1f8.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_1d8 = paVar20;
        local_1d0 = puVar28;
        do {
          pvVar12 = local_308.
                    super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pvVar11 = local_308.
                    super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar25 = (pointer)local_308.
                             super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          local_338 = dVar38;
          if (local_308.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_308.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pvVar7 = (void *)pIVar25->X;
              if (pvVar7 != (void *)0x0) {
                operator_delete(pvVar7,pIVar25[1].X - (long)pvVar7);
              }
              pIVar30 = pIVar25 + 1;
              pIVar25 = (pointer)&pIVar30->Y;
            } while ((pointer)&pIVar30->Y != pvVar12);
            local_308.
            super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar11;
          }
          local_258.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_258.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_258.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pIVar30 = (pEVar22->outer).
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (pIVar25 = (pEVar22->outer).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start; pIVar25 != pIVar30;
              pIVar25 = pIVar25 + 1) {
            local_1a8._vptr_Clipper = (_func_int **)operator_new(0x28);
            lVar29 = pIVar25->Y;
            ((pointer)local_1a8._vptr_Clipper)->solid =
                 (IfcSolidModel *)((double)pIVar25->X / 1518500249.0);
            (((pointer)local_1a8._vptr_Clipper)->extrusionDir).x = (double)lVar29 / 1518500249.0;
            (((pointer)local_1a8._vptr_Clipper)->extrusionDir).y = 0.0;
            (((pointer)local_1a8._vptr_Clipper)->extrusionDir).z = 0.0;
            (((pointer)local_1a8._vptr_Clipper)->profileMesh).
            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::vector<p2t::Point*,std::allocator<p2t::Point*>>::emplace_back<p2t::Point*>
                      ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)&local_258,
                       (Point **)&local_1a8);
          }
          local_3a0 = (CDT *)operator_new(0x10);
          p2t::CDT::CDT(local_3a0,&local_258);
          pTVar23 = (pointer)(pEVar22->holes).
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          local_340 = (pointer)(pEVar22->holes).
                               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          local_330 = pEVar22;
          if (pTVar23 != local_340) {
            do {
              local_1a8._vptr_Clipper = (_func_int **)0x0;
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              std::
              vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
              ::emplace_back<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>
                        ((vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
                          *)&local_308,
                         (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&local_1a8);
              if ((pointer)local_1a8._vptr_Clipper != (pointer)0x0) {
                operator_delete(local_1a8._vptr_Clipper,
                                (long)local_1a8.m_PolyOuts.
                                      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1a8._vptr_Clipper);
              }
              pIVar30 = (pointer)&((pointer)
                                  ((long)local_308.
                                         super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + -0x20))->Y;
              pIVar8 = (IfcSolidModel *)(pTVar23->extrusionDir).x;
              for (pIVar26 = pTVar23->solid; pIVar26 != pIVar8;
                  pIVar26 = (IfcSolidModel *)
                            &(pIVar26->super_IfcGeometricRepresentationItem).
                             super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             .field_0x10) {
                local_1a8._vptr_Clipper = (_func_int **)operator_new(0x28);
                lVar29 = *(long *)&(pIVar26->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   .field_0x8;
                ((pointer)local_1a8._vptr_Clipper)->solid =
                     (IfcSolidModel *)
                     ((double)(long)(pIVar26->super_IfcGeometricRepresentationItem).
                                    super_IfcRepresentationItem.
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                    ._vptr_ObjectHelper / 1518500249.0);
                (((pointer)local_1a8._vptr_Clipper)->extrusionDir).x = (double)lVar29 / 1518500249.0
                ;
                (((pointer)local_1a8._vptr_Clipper)->extrusionDir).y = 0.0;
                (((pointer)local_1a8._vptr_Clipper)->extrusionDir).z = 0.0;
                (((pointer)local_1a8._vptr_Clipper)->profileMesh).
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::vector<p2t::Point*,std::allocator<p2t::Point*>>::emplace_back<p2t::Point*>
                          ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)pIVar30,
                           (Point **)&local_1a8);
              }
              p2t::CDT::AddHole(local_3a0,
                                (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)pIVar30);
              pTVar23 = (pointer)&(pTVar23->extrusionDir).z;
            } while (pTVar23 != local_340);
          }
          this = local_3a0;
          p2t::CDT::Triangulate(local_3a0);
          p2t::CDT::GetTriangles
                    ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&local_1a8,this);
          ppOVar14 = local_1a8.m_PolyOuts.
                     super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          for (pTVar23 = (pointer)local_1a8._vptr_Clipper; pTVar23 != (pointer)ppOVar14;
              pTVar23 = (pointer)&pTVar23->extrusionDir) {
            pIVar26 = pTVar23->solid;
            lVar29 = 1;
            do {
              pp_Var9 = (&(pIVar26->super_IfcGeometricRepresentationItem).
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper)[lVar29];
              p_Var3 = *pp_Var9;
              if ((((1.0 < (double)p_Var3) || ((double)p_Var3 < 0.0)) ||
                  (p_Var4 = pp_Var9[1], 1.0 < (double)p_Var4)) || ((double)p_Var4 < 0.0)) {
                __assert_fail("v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCOpenings.cpp"
                              ,0x68a,
                              "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                             );
              }
              dVar38 = (double)p_Var3 * (double)local_3a8 + local_370;
              dVar39 = (double)p_Var4 * local_378 + local_368;
              local_3f8[0].x =
                   local_320 * dVar38 + (double)local_208._0_8_ * dVar39 + (double)local_218._0_8_;
              local_3f8[0].y = local_278 * dVar38 + local_270 * dVar39 + local_310;
              local_3f8[0].z = dVar38 * local_268 + dVar39 * local_260 + local_318;
              __position._M_current =
                   (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                           __position,local_3f8);
              }
              else {
                (__position._M_current)->z = local_3f8[0].z;
                (__position._M_current)->x = local_3f8[0].x;
                (__position._M_current)->y = local_3f8[0].y;
                ppaVar1 = &(curmesh->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != 4);
            local_3f8[0].x = (double)CONCAT44(local_3f8[0].x._4_4_,3);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_328,
                       (uint *)local_3f8);
            pIVar30 = (pointer)0x0;
          }
          if ((pointer)local_1a8._vptr_Clipper != (pointer)0x0) {
            operator_delete(local_1a8._vptr_Clipper,
                            (long)local_1a8.m_PolyOuts.
                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1a8._vptr_Clipper);
          }
          pEVar22 = local_330;
          dVar38 = (double)CONCAT71((int7)((ulong)pIVar30 >> 8),1);
          if (local_258.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_258.
                            super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_258.
                                  super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_258.
                                  super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pEVar22 = pEVar22 + 1;
          paVar20 = local_1d8;
          puVar28 = local_1d0;
        } while (pEVar22 != local_2f0);
      }
      bVar15 = SUB81(dVar38,0);
      if (((ulong)dVar38 & 1) == 0) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                   (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_348,paVar20);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_328,
                   (curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_350,puVar28);
        LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5a2889);
      }
      std::
      vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ::~vector(&local_308);
      if (local_350 != (pointer)0x0) {
        operator_delete(local_350,(long)local_280 - (long)local_350);
      }
      if (local_348 != (pointer)0x0) {
        operator_delete(local_348,(long)local_358 - (long)local_348);
      }
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector(&local_238);
    std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&local_1f8);
    if (local_2e8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (aiVector2t<double> *)0x0) {
      operator_delete(local_2e8.
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2e8.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool TryAddOpenings_Poly2Tri(const std::vector<TempOpening>& openings,const std::vector<IfcVector3>& nors,
    TempMesh& curmesh)
{
    IFCImporter::LogWarn("forced to use poly2tri fallback method to generate wall openings");
    std::vector<IfcVector3>& out = curmesh.mVerts;

    bool result = false;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system.
    bool ok;
    IfcVector3 nor;
    const IfcMatrix3 m = DerivePlaneCoordinateSpace(curmesh, ok, nor);
    if (!ok) {
        return false;
    }

    const IfcMatrix3 minv = IfcMatrix3(m).Inverse();


    IfcFloat coord = -1;

    std::vector<IfcVector2> contour_flat;
    contour_flat.reserve(out.size());

    IfcVector2 vmin, vmax;
    MinMaxChooser<IfcVector2>()(vmin, vmax);

    // Move all points into the new coordinate system, collecting min/max verts on the way
    for(IfcVector3& x : out) {
        const IfcVector3 vv = m * x;

        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).


        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }

        coord = vv.z;

        vmin = std::min(IfcVector2(vv.x, vv.y), vmin);
        vmax = std::max(IfcVector2(vv.x, vv.y), vmax);

        contour_flat.push_back(IfcVector2(vv.x,vv.y));
    }

    // With the current code in DerivePlaneCoordinateSpace,
    // vmin,vmax should always be the 0...1 rectangle (+- numeric inaccuracies)
    // but here we won't rely on this.

    vmax -= vmin;

    // If this happens then the projection must have been wrong.
    ai_assert(vmax.Length());

    ClipperLib::ExPolygons clipped;
    ClipperLib::Polygons holes_union;


    IfcVector3 wall_extrusion;
    bool first = true;

    try {

        ClipperLib::Clipper clipper_holes;
        size_t c = 0;

        for(const TempOpening& t :openings) {
            const IfcVector3& outernor = nors[c++];
            const IfcFloat dot = nor * outernor;
            if (std::fabs(dot)<1.f-1e-6f) {
                continue;
            }

            const std::vector<IfcVector3>& va = t.profileMesh->mVerts;
            if(va.size() <= 2) {
                continue;
            }

            std::vector<IfcVector2> contour;

            for(const IfcVector3& xx : t.profileMesh->mVerts) {
                IfcVector3 vv = m *  xx, vv_extr = m * (xx + t.extrusionDir);

                const bool is_extruded_side = std::fabs(vv.z - coord) > std::fabs(vv_extr.z - coord);
                if (first) {
                    first = false;
                    if (dot > 0.f) {
                        wall_extrusion = t.extrusionDir;
                        if (is_extruded_side) {
                            wall_extrusion = - wall_extrusion;
                        }
                    }
                }

                // XXX should not be necessary - but it is. Why? For precision reasons?
                vv = is_extruded_side ? vv_extr : vv;
                contour.push_back(IfcVector2(vv.x,vv.y));
            }

            ClipperLib::Polygon hole;
            for(IfcVector2& pip : contour) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                hole.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            }

            if (!ClipperLib::Orientation(hole)) {
                std::reverse(hole.begin(), hole.end());
            //  assert(ClipperLib::Orientation(hole));
            }

            /*ClipperLib::Polygons pol_temp(1), pol_temp2(1);
            pol_temp[0] = hole;

            ClipperLib::OffsetPolygons(pol_temp,pol_temp2,5.0);
            hole = pol_temp2[0];*/

            clipper_holes.AddPolygon(hole,ClipperLib::ptSubject);
        }

        clipper_holes.Execute(ClipperLib::ctUnion,holes_union,
            ClipperLib::pftNonZero,
            ClipperLib::pftNonZero);

        if (holes_union.empty()) {
            return false;
        }

        // Now that we have the big union of all holes, subtract it from the outer contour
        // to obtain the final polygon to feed into the triangulator.
        {
            ClipperLib::Polygon poly;
            for(IfcVector2& pip : contour_flat) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                poly.push_back(ClipperLib::IntPoint( to_int64(pip.x), to_int64(pip.y) ));
            }

            if (ClipperLib::Orientation(poly)) {
                std::reverse(poly.begin(), poly.end());
            }
            clipper_holes.Clear();
            clipper_holes.AddPolygon(poly,ClipperLib::ptSubject);

            clipper_holes.AddPolygons(holes_union,ClipperLib::ptClip);
            clipper_holes.Execute(ClipperLib::ctDifference,clipped,
                ClipperLib::pftNonZero,
                ClipperLib::pftNonZero);
        }

    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, skipping openings for this face: (Clipper: "
            + std::string(sx) + ")");

        return false;
    }

    std::vector<IfcVector3> old_verts;
    std::vector<unsigned int> old_vertcnt;

    old_verts.swap(curmesh.mVerts);
    old_vertcnt.swap(curmesh.mVertcnt);

    std::vector< std::vector<p2t::Point*> > contours;
    for(ClipperLib::ExPolygon& clip : clipped) {

        contours.clear();

        // Build the outer polygon contour line for feeding into poly2tri
        std::vector<p2t::Point*> contour_points;
        for(ClipperLib::IntPoint& point : clip.outer) {
            contour_points.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
        }

        p2t::CDT* cdt ;
        try {
            // Note: this relies on custom modifications in poly2tri to raise runtime_error's
            // instead if assertions. These failures are not debug only, they can actually
            // happen in production use if the input data is broken. An assertion would be
            // inappropriate.
            cdt = new p2t::CDT(contour_points);
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }


        // Build the poly2tri inner contours for all holes we got from ClipperLib
        for(ClipperLib::Polygon& opening : clip.holes) {

            contours.push_back(std::vector<p2t::Point*>());
            std::vector<p2t::Point*>& contour = contours.back();

            for(ClipperLib::IntPoint& point : opening) {
                contour.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
            }

            cdt->AddHole(contour);
        }

        try {
            // Note: See above
            cdt->Triangulate();
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }

        const std::vector<p2t::Triangle*> tris = cdt->GetTriangles();

        // Collect the triangles we just produced
        for(p2t::Triangle* tri : tris) {
            for(int i = 0; i < 3; ++i) {

                const IfcVector2 v = IfcVector2(
                    static_cast<IfcFloat>( tri->GetPoint(i)->x ),
                    static_cast<IfcFloat>( tri->GetPoint(i)->y )
                );

                ai_assert(v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0);
                const IfcVector3 v3 = minv * IfcVector3(vmin.x + v.x * vmax.x, vmin.y + v.y * vmax.y,coord) ;

                curmesh.mVerts.push_back(v3);
            }
            curmesh.mVertcnt.push_back(3);
        }

        result = true;
    }

    if (!result) {
        // revert -- it's a shame, but better than nothing
        curmesh.mVerts.insert(curmesh.mVerts.end(),old_verts.begin(), old_verts.end());
        curmesh.mVertcnt.insert(curmesh.mVertcnt.end(),old_vertcnt.begin(), old_vertcnt.end());

        IFCImporter::LogError("Ifc: revert, could not generate openings for this wall");
    }

    return result;
}